

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InstancedExpansionShader::shadePrimitives
          (InstancedExpansionShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  float x_;
  float y_;
  Vector<float,_4> local_e4;
  Vec4 local_d4;
  Vector<float,_4> local_c4;
  Vec4 local_b4;
  Vector<float,_4> local_a4;
  Vec4 local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  undefined1 local_64 [8];
  Vec4 centerPosition;
  float phase;
  Vec4 basePosition;
  VertexPacket *vertex;
  int packetNdx;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  int verticesIn_local;
  GeometryEmitter *output_local;
  InstancedExpansionShader *this_local;
  
  for (vertex._4_4_ = 0; vertex._4_4_ < numPackets; vertex._4_4_ = vertex._4_4_ + 1) {
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(centerPosition.m_data + 3),
               &packets[vertex._4_4_].vertices[0]->position);
    centerPosition.m_data[2] =
         ((float)invocationID / (float)*(int *)&(this->super_ShaderProgram).field_0x154) * 6.3;
    x_ = ::deFloatCos(centerPosition.m_data[2]);
    y_ = ::deFloatSin(centerPosition.m_data[2]);
    tcu::Vector<float,_4>::Vector(&local_84,x_,y_,0.0,0.0);
    tcu::operator*((tcu *)&local_74,&local_84,0.1);
    tcu::operator+((tcu *)local_64,(Vector<float,_4> *)(centerPosition.m_data + 3),&local_74);
    tcu::Vector<float,_4>::Vector(&local_a4,0.0,-0.1,0.0,0.0);
    tcu::operator+((tcu *)&local_94,(Vector<float,_4> *)local_64,&local_a4);
    rr::GeometryEmitter::EmitVertex
              (output,&local_94,0.0,(GenericVec4 *)0x0,packets[vertex._4_4_].primitiveIDIn);
    tcu::Vector<float,_4>::Vector(&local_c4,-0.05,0.0,0.0,0.0);
    tcu::operator+((tcu *)&local_b4,(Vector<float,_4> *)local_64,&local_c4);
    rr::GeometryEmitter::EmitVertex
              (output,&local_b4,0.0,(GenericVec4 *)0x0,packets[vertex._4_4_].primitiveIDIn);
    tcu::Vector<float,_4>::Vector(&local_e4,0.05,0.0,0.0,0.0);
    tcu::operator+((tcu *)&local_d4,(Vector<float,_4> *)local_64,&local_e4);
    rr::GeometryEmitter::EmitVertex
              (output,&local_d4,0.0,(GenericVec4 *)0x0,packets[vertex._4_4_].primitiveIDIn);
    rr::GeometryEmitter::EndPrimitive(output);
  }
  return;
}

Assistant:

void InstancedExpansionShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex			= packets[packetNdx].vertices[0];
		const tcu::Vec4			basePosition	= vertex->position;
		const float				phase			= float(invocationID) / float(m_numInvocations) * 6.3f;
		const tcu::Vec4			centerPosition	= basePosition + tcu::Vec4(deFloatCos(phase), deFloatSin(phase), 0.0f, 0.0f) * 0.1f;

		output.EmitVertex(centerPosition + tcu::Vec4( 0.0f,  -0.1f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4(-0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4( 0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EndPrimitive();
	}
}